

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O2

void __thiscall QPageSetupWidget::initPageSizes(QPageSetupWidget *this)

{
  QComboBox *pQVar1;
  QDoubleSpinBox *pQVar2;
  bool bVar3;
  int iVar4;
  QPlatformPrinterSupport *pQVar5;
  long lVar6;
  PageSizeId PVar7;
  QPageSize *pageSize;
  QPageSize *value;
  long in_FS_OFFSET;
  QPageSize pageSize_1;
  QArrayDataPointer<QPageSize> local_88;
  QPageSize defaultSize;
  QPrintDevice local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 = 1;
  QComboBox::clear();
  *(undefined4 *)((long)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 + 4) = 0xffffffff;
  if ((*(int *)&this[1].super_Ui_QPageSetupWidget.heightLabel == 0) &&
     (this[1].super_Ui_QPageSetupWidget.paperSource != (QComboBox *)0x0)) {
    pQVar5 = QPlatformPrinterSupportPlugin::get();
    if (pQVar5 != (QPlatformPrinterSupport *)0x0) {
      local_68.d.value.ptr._0_4_ = 0xaaaaaaaa;
      local_68.d.value.ptr._4_4_ = 0xaaaaaaaa;
      local_68.d.d._0_4_ = 0xaaaaaaaa;
      local_68.d.d._4_4_ = 0xaaaaaaaa;
      (*pQVar5->_vptr_QPlatformPrinterSupport[4])
                (&local_68,pQVar5,&this[1].super_Ui_QPageSetupWidget.pageHeight);
      _defaultSize = 0xaaaaaaaaaaaaaaaa;
      QPrintDevice::defaultPageSize((QPrintDevice *)&defaultSize);
      local_88.size = -0x5555555555555556;
      local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_88.ptr = (QPageSize *)0xaaaaaaaaaaaaaaaa;
      QPrintDevice::supportedPageSizes((QList<QPageSize> *)&local_88,&local_68);
      value = local_88.ptr;
      for (lVar6 = local_88.size << 3;
          pQVar1 = (QComboBox *)(this->super_Ui_QPageSetupWidget).pageHeight, lVar6 != 0;
          lVar6 = lVar6 + -8) {
        QPageSize::name();
        QVariant::fromValue<QPageSize>
                  ((enable_if_t<std::is_copy_constructible_v<QPageSize>_&&_std::is_destructible_v<QPageSize>,_QVariant>
                    *)&local_58,value);
        QComboBox::addItem(pQVar1,(QString *)&pageSize_1,(QVariant *)&local_58);
        QVariant::~QVariant((QVariant *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pageSize_1);
        value = value + 8;
      }
      iVar4 = QComboBox::count();
      if (0 < iVar4) {
        bVar3 = QPrintDevice::supportsCustomPageSizes(&local_68);
        if (bVar3) {
          pQVar1 = (QComboBox *)(this->super_Ui_QPageSetupWidget).pageHeight;
          tr((QString *)&pageSize_1,"Custom",(char *)0x0,-1);
          local_58.shared = (PrivateShared *)0x0;
          local_58._8_8_ = 0;
          local_58._16_8_ = 0;
          local_40 = 2;
          QComboBox::addItem(pQVar1,(QString *)&pageSize_1,(QVariant *)&local_58);
          QVariant::~QVariant((QVariant *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&pageSize_1);
          iVar4 = QComboBox::count();
          *(int *)((long)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 + 4) = iVar4 + -1;
        }
        *(undefined1 *)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 = 0;
        QComboBox::setCurrentIndex((int)(this->super_Ui_QPageSetupWidget).pageHeight);
        pQVar2 = (this->super_Ui_QPageSetupWidget).pageHeight;
        QVariant::fromValue<QPageSize>
                  ((enable_if_t<std::is_copy_constructible_v<QPageSize>_&&_std::is_destructible_v<QPageSize>,_QVariant>
                    *)&local_58,&defaultSize);
        QComboBox::findData(pQVar2,&local_58,0x100,0x10);
        QComboBox::setCurrentIndex((int)pQVar2);
        QVariant::~QVariant((QVariant *)&local_58);
        QArrayDataPointer<QPageSize>::~QArrayDataPointer(&local_88);
        QPageSize::~QPageSize(&defaultSize);
        QPrintDevice::~QPrintDevice(&local_68);
        goto LAB_0013db46;
      }
      QArrayDataPointer<QPageSize>::~QArrayDataPointer(&local_88);
      QPageSize::~QPageSize(&defaultSize);
      QPrintDevice::~QPrintDevice(&local_68);
    }
  }
  PVar7 = AnsiA;
  do {
    if (PVar7 == Custom) {
      pQVar1 = (QComboBox *)(this->super_Ui_QPageSetupWidget).pageHeight;
      tr((QString *)&local_88,"Custom",(char *)0x0,-1);
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      QComboBox::addItem(pQVar1,(QString *)&local_88,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      iVar4 = QComboBox::count();
      *(int *)((long)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 + 4) = iVar4 + -1;
    }
    else {
      if (PVar7 == EnvelopeYou4) break;
      _pageSize_1 = (Data *)0xaaaaaaaaaaaaaaaa;
      QPageSize::QPageSize(&pageSize_1,PVar7);
      pQVar1 = (QComboBox *)(this->super_Ui_QPageSetupWidget).pageHeight;
      QPageSize::name();
      QVariant::fromValue<QPageSize>
                ((enable_if_t<std::is_copy_constructible_v<QPageSize>_&&_std::is_destructible_v<QPageSize>,_QVariant>
                  *)&local_58,&pageSize_1);
      QComboBox::addItem(pQVar1,(QString *)&local_88,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      QPageSize::~QPageSize(&pageSize_1);
    }
    PVar7 = PVar7 + Legal;
  } while( true );
  *(undefined1 *)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 = 0;
LAB_0013db46:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPageSetupWidget::initPageSizes()
{
    m_blockSignals = true;

    m_ui.pageSizeCombo->clear();

    m_realCustomPageSizeIndex = -1;

    if (m_outputFormat == QPrinter::NativeFormat && !m_printerName.isEmpty()) {
        QPlatformPrinterSupport *ps = QPlatformPrinterSupportPlugin::get();
        if (ps) {
            QPrintDevice printDevice = ps->createPrintDevice(m_printerName);
            const QPageSize defaultSize = printDevice.defaultPageSize();
            const auto pageSizes = printDevice.supportedPageSizes();
            for (const QPageSize &pageSize : pageSizes)
                m_ui.pageSizeCombo->addItem(pageSize.name(), QVariant::fromValue(pageSize));
            if (m_ui.pageSizeCombo->count() > 0) {
                if (printDevice.supportsCustomPageSizes()) {
                    m_ui.pageSizeCombo->addItem(tr("Custom"));
                    m_realCustomPageSizeIndex = m_ui.pageSizeCombo->count() - 1;
                }
                m_blockSignals = false;

                // If the defaultSize is index 0, setCurrentIndex won't emit the currentIndexChanged
                // signal; workaround the issue by initially setting the currentIndex to -1
                m_ui.pageSizeCombo->setCurrentIndex(-1);
                m_ui.pageSizeCombo->setCurrentIndex(m_ui.pageSizeCombo->findData(QVariant::fromValue(defaultSize)));
                return;
            }
        }
    }

    // If PdfFormat or no available printer page sizes, populate with all page sizes
    for (int id = 0; id < QPageSize::LastPageSize; ++id) {
        if (QPageSize::PageSizeId(id) == QPageSize::Custom) {
            m_ui.pageSizeCombo->addItem(tr("Custom"));
            m_realCustomPageSizeIndex = m_ui.pageSizeCombo->count() - 1;
        } else {
            QPageSize pageSize = QPageSize(QPageSize::PageSizeId(id));
            m_ui.pageSizeCombo->addItem(pageSize.name(), QVariant::fromValue(pageSize));
        }
    }

    m_blockSignals = false;
}